

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision_frontend.cpp
# Opt level: O2

void __thiscall
CollisionFrontend::print_broad_clash_counts
          (CollisionFrontend *this,Structure *Conf,vector<int,_std::allocator<int>_> *starts,
          vector<int,_std::allocator<int>_> *ends,bool b_ignore_self)

{
  double elem_radius;
  pointer paVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined3 in_register_00000081;
  ulong uVar10;
  int iVar11;
  Atom *pAVar12;
  long lVar13;
  atom_info infos [2];
  filter_results_t nearby_atoms;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  undefined1 local_f8 [12];
  uint uStack_ec;
  undefined8 local_e8;
  ulong local_e0;
  ulong local_d8;
  double local_d0;
  ulong local_c8;
  int local_c0;
  undefined4 local_bc;
  long local_b8;
  ulong local_b0;
  CollisionFrontend *local_a8;
  ulong local_a0;
  _Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
  local_98;
  vector<int,_std::allocator<int>_> *local_80;
  long local_78;
  vector<int,_std::allocator<int>_> *local_70;
  long local_68;
  collision_grid_prot *local_60;
  Membrane *local_58;
  double local_50;
  double local_48;
  Residue *local_40;
  Atom *local_38;
  
  local_bc = CONCAT31(in_register_00000081,b_ignore_self);
  local_70 = ends;
  if ((long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start !=
      (long)(ends->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(ends->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start) {
    __assert_fail("starts.size() == ends.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                  ,0x1e5,
                  "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                 );
  }
  std::operator<<((ostream *)&std::cout,"res,bbc,scc,tot,mc\n");
  local_e8 = 0;
  local_f8._0_4_ = 0;
  local_f8._4_4_ = 0;
  stack0xffffffffffffff10 = 0;
  local_78 = (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(starts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2;
  local_58 = &this->m_membrane;
  local_60 = &this->m_broad_phase;
  local_b0 = 0;
  lVar9 = 0;
  local_104 = 0;
  local_108 = 0;
  local_10c = 0;
  local_a8 = this;
  local_80 = starts;
  do {
    if (lVar9 == local_78) {
      poVar6 = std::operator<<((ostream *)&std::cout,"TOTAL BB CLASHES: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10c);
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,"TOTAL SC CLASHES: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_108);
      std::endl<char,std::char_traits<char>>(poVar6);
      poVar6 = std::operator<<((ostream *)&std::cout,"TOTAL MEMB CLASHES: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_104);
      std::endl<char,std::char_traits<char>>(poVar6);
      return;
    }
    local_100 = (int)local_b0;
    local_b8 = lVar9;
    for (uVar10 = (ulong)(local_80->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar9];
        uVar10 <= (ulong)(long)(local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start[local_b8]; uVar10 = uVar10 + 1) {
      if (uVar10 != (long)Conf->_res[uVar10]._posn) {
        __assert_fail("res._posn == i_res",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                      ,0x1fd,
                      "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                     );
      }
      local_40 = Conf->_res + uVar10;
      local_c0 = (int)uVar10 + -2;
      uVar8 = 0;
      local_fc = local_100;
      local_e0 = 0;
      local_d8 = 0;
      iVar4 = 0;
      local_a0 = uVar10;
      local_68 = uVar10 * 0x150;
      while( true ) {
        if ((long)local_40->_numAtom <= (long)uVar8) break;
        pAVar12 = local_40->_atom + uVar8;
        uVar2 = VdwUtils::should_ignore_atom(pAVar12);
        local_c8 = uVar8;
        if (uVar2 == 0) {
          if (uVar8 < 6) {
            local_100 = (int)uVar10;
            local_f8._0_4_ = local_100;
            if ((long)uVar10 < 1) {
              __assert_fail("infos[e1_3_gobbo].res_ix >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x211,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            if (Conf->_numRes < local_100) {
              __assert_fail("infos[e1_3_gobbo].res_ix <= Conf._numRes",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x212,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            local_f8._4_4_ = (int)uVar8;
            stack0xffffffffffffff10 =
                 CONCAT62(stack0xffffffffffffff12,
                          *(undefined2 *)((long)Conf->_res->_scChi + local_68 + -0x20));
            local_b0 = uVar10 & 0xffffffff;
            local_fc = local_100;
          }
          iVar3 = Membrane::collides(local_58,pAVar12,local_a8->m_ofac2[2]);
          local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d0 = (pAVar12->super_Point).x;
          local_48 = (pAVar12->super_Point).y;
          local_50 = (pAVar12->super_Point).z;
          local_38 = pAVar12;
          elem_radius = collision_grid_prot::elem_radius(pAVar12);
          collision_grid_prot::filter
                    (local_60,(filter_results_t *)&local_98,local_d0,local_48,local_50,elem_radius);
          local_d0 = (double)CONCAT44(local_d0._4_4_,(iVar4 + 1) - (uint)(iVar3 == 0));
          lVar9 = (long)local_98._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_98._M_impl.super__Vector_impl_data._M_start;
          for (lVar13 = 0; paVar1 = local_98._M_impl.super__Vector_impl_data._M_start,
              lVar9 >> 3 != lVar13; lVar13 = lVar13 + 1) {
            uVar10 = (ulong)local_98._M_impl.super__Vector_impl_data._M_start[lVar13].res_ix;
            if (uVar10 == 0) {
              __assert_fail("nearby_atom_key.res_ix >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x226,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            if ((uint)Conf->_numRes <
                local_98._M_impl.super__Vector_impl_data._M_start[lVar13].res_ix) {
              __assert_fail("nearby_atom_key.res_ix <= static_cast<unsigned int>(Conf._numRes)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x227,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            if ((uint)(int)Conf->_res[uVar10]._numAtom <=
                local_98._M_impl.super__Vector_impl_data._M_start[lVar13].atom_ix) {
              __assert_fail("nearby_atom_key.atom_ix < static_cast<unsigned int>(Conf._res[nearby_atom_key.res_ix]._numAtom)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x229,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            pAVar12 = Conf->_res[uVar10]._atom +
                      local_98._M_impl.super__Vector_impl_data._M_start[lVar13].atom_ix;
            uVar2 = VdwUtils::should_ignore_atom(pAVar12);
            if (uVar2 != 0) {
              __assert_fail("!VdwUtils::should_ignore_atom(nearby_atom)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/collision_frontend.cpp"
                            ,0x22b,
                            "void CollisionFrontend::print_broad_clash_counts(const class Structure &, const std::vector<int> &, const std::vector<int> &, const bool) const"
                           );
            }
            uVar2 = paVar1[lVar13].res_ix;
            if (((char)local_bc == '\0') || (local_a0 != uVar2)) {
              if (local_c8 < 6) {
                stack0xffffffffffffff10 = CONCAT44(uVar2,local_f8._8_4_);
                local_e8._0_6_ = CONCAT24(Conf->_res[uVar2]._type,paVar1[lVar13].atom_ix);
                iVar4 = anon_unknown.dwarf_1bb7c::gobbo_are_1_3_connected((atom_info *)local_f8);
                if (iVar4 == 0) {
                  lVar5 = (ulong)(local_fc < (int)uVar2) * 0xc;
                  lVar7 = (ulong)((int)uVar2 <= local_fc) * 0xc;
                  if (((*(int *)(local_f8 + lVar5) - *(int *)(local_f8 + lVar7) != 1) ||
                      (*(int *)(local_f8 + lVar5 + 4) != 1)) ||
                     (*(int *)(local_f8 + lVar7 + 4) != 3)) goto LAB_00121191;
                }
              }
              else {
LAB_00121191:
                iVar4 = anon_unknown.dwarf_1bb7c::atoms_overlap
                                  (local_38,pAVar12,
                                   local_a8->m_ofac2[local_c0 - paVar1[lVar13].res_ix < 0xfffffffd])
                ;
                if (iVar4 != 0) {
                  local_e0 = (ulong)((int)local_e0 + (uint)(local_c8 < 6));
                  local_d8 = (ulong)(((int)local_d8 + 1) - (uint)(local_c8 < 6));
                  break;
                }
              }
            }
          }
          std::
          _Vector_base<collision_grid_prot::atom_key,_std::allocator<collision_grid_prot::atom_key>_>
          ::~_Vector_base(&local_98);
          uVar10 = local_a0;
          iVar4 = local_d0._0_4_;
        }
        uVar8 = local_c8 + 1;
      }
      poVar6 = std::operator<<((ostream *)&std::cout,
                               (string *)(Residue::Name3_abi_cxx11_ + local_40->_type));
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6,",");
      iVar11 = (int)local_e0;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar11);
      poVar6 = std::operator<<(poVar6,",");
      iVar3 = (int)local_d8;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6,",");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3 + iVar11);
      poVar6 = std::operator<<(poVar6,",");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
      std::endl<char,std::char_traits<char>>(poVar6);
      local_10c = local_10c + iVar11;
      local_108 = local_108 + iVar3;
      local_104 = local_104 + iVar4;
    }
    lVar9 = local_b8 + 1;
  } while( true );
}

Assistant:

void CollisionFrontend::print_broad_clash_counts(const class Structure &Conf,
    const std::vector<int> &starts,
    const std::vector<int> &ends,
    const bool b_ignore_self) const {
 
    assert(starts.size() == ends.size());   
    std::cout << "res,bbc,scc,tot,mc\n";
    
    // Structure used for detecting whether two backbone atoms are within two bonds or
    // less of each other
    struct atom_info infos[e1_3_num] = { 0 };

    // The overlap factor: If the ratio of distance between two atoms centers
    // to the sum of their atomic radii is less than this value, then the atoms
    // are colliding.
    double ofac2 = 1.0;
    
    const size_t num_loops = starts.size();

    // Total number of loop backbone atoms that clash with protein
    int total_bb_clashes = 0;
    // Total number of loop side chain atoms that clash with protein
    int total_sc_clashes = 0;
    // Total number of loop atoms that clash with membrane
    int total_memb_clashes = 0;

    for (size_t i_loop = 0; i_loop < num_loops; ++i_loop) {
        for (size_t i_res = starts[i_loop]; i_res <= ends[i_loop]; ++i_res) {
            const Residue &res = Conf._res[i_res];
            assert(res._posn == i_res);

            // Total number of backbone atoms at this residue that clash with protein
            int bb_clashes = 0;
            // Total number of side chain atoms at this residue that clash with protein
            int sc_clashes = 0;
            // Total number of atoms at this residue that clash with membrane
            int memb_clashes = 0;

            for (short i_atom = 0; i_atom < res._numAtom; ++i_atom) {
                // Obtain handle to atom
                const Atom &atom = res._atom[i_atom];
                if (VdwUtils::should_ignore_atom(atom)) {
                    continue;
                }

                // 1-3 collision filter for backbone atoms
                const bool is_bb_atom = (i_atom < NUM_BB_ATOM);
                if (is_bb_atom) {
                    infos[e1_3_gobbo].res_ix = static_cast<int>(i_res);
                    assert(infos[e1_3_gobbo].res_ix >= 1);
                    assert(infos[e1_3_gobbo].res_ix <= Conf._numRes);
                    infos[e1_3_gobbo].atom_ix = i_atom;
                    infos[e1_3_gobbo].res_type = Conf._res[infos[e1_3_gobbo].res_ix]._type;
                }

                // Check against membrane
                if (m_membrane.collides(atom, m_ofac2[eIxOFAC_memb])) {
                    ++memb_clashes;
                }

                // Broad phase
                collision_grid_prot::filter_results_t nearby_atoms;
                m_broad_phase.filter(nearby_atoms,
                                     atom.x, atom.y, atom.z,
                                     collision_grid_prot::elem_radius(atom));

                // Narrow phase
                const size_t num_nearby_atoms = nearby_atoms.size();
                for (size_t i_nearby_atom = 0; i_nearby_atom < num_nearby_atoms; ++i_nearby_atom) {
                    const collision_grid_prot::atom_key &nearby_atom_key = nearby_atoms[i_nearby_atom];
                    assert(nearby_atom_key.res_ix >= 1);
                    assert(nearby_atom_key.res_ix <= static_cast<unsigned int>(Conf._numRes));
                    assert(nearby_atom_key.atom_ix >= 0);
                    assert(nearby_atom_key.atom_ix < static_cast<unsigned int>(Conf._res[nearby_atom_key.res_ix]._numAtom));
                    const Atom &nearby_atom = Conf._res[nearby_atom_key.res_ix]._atom[nearby_atom_key.atom_ix];
                    assert(!VdwUtils::should_ignore_atom(nearby_atom));

                    // Skip self residues
                    if (b_ignore_self && (nearby_atom_key.res_ix == i_res)) {
                        continue;
                    }

                    // Skip if 1-3 connected (connected within at most 2 bonds)
                    // only supported if first atom is backbone atom
                    if (is_bb_atom)
                    {
                        infos[e1_3_alt].res_ix = nearby_atom_key.res_ix;
                        infos[e1_3_alt].atom_ix = nearby_atom_key.atom_ix;
                        infos[e1_3_alt].res_type = Conf._res[nearby_atom_key.res_ix]._type;
                        if (gobbo_are_1_3_connected(infos)) {
                            continue;
                        }

                        // HACK: Ca+1 and carbonyl O always seem to clash,
                        // even in native structure so ignore that specific interaction
                        if (hack_ignore_Ca1_with_O_clash(infos)) {
                            continue;
                        }
                    }

                    // Check for overlap
                    ofac2 = get_ofac2(static_cast<int>(i_res), static_cast<int>(nearby_atom_key.res_ix));
                    if (atoms_overlap(atom, nearby_atom, ofac2)) {
                        if (is_bb_atom) {
                            ++bb_clashes;
                        }
                        else {
                            ++sc_clashes;
                        }
                        // Check next atom for clashes
                        break;
                    }
                } // end narrow phase check

            } // end iteration over atoms

            std::cout << res.get_name_3() << ":" << i_res << ","
                      << bb_clashes << ","
                      << sc_clashes << ","
                      << bb_clashes + sc_clashes << ","
                      << memb_clashes << std::endl;

            total_bb_clashes += bb_clashes;
            total_sc_clashes += sc_clashes;
            total_memb_clashes += memb_clashes;

        } // end iteration over residues
    } // end iteration over loops

    std::cout << "TOTAL BB CLASHES: " << total_bb_clashes << std::endl;
    std::cout << "TOTAL SC CLASHES: " << total_sc_clashes << std::endl;
    std::cout << "TOTAL MEMB CLASHES: " << total_memb_clashes << std::endl;
}